

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::Descriptor::DebugString
          (Descriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options,
          bool include_opening_clause)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  once_flag *poVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  OneofDescriptor *this_00;
  size_t sVar6;
  _Rb_tree_header *p_Var7;
  long lVar8;
  DebugStringOptions *debug_string_options_00;
  int iVar9;
  Descriptor *this_01;
  long lVar10;
  long lVar11;
  string prefix;
  SubstituteArg local_308;
  SubstituteArg local_2d8;
  SubstituteArg local_2a8;
  SubstituteArg local_278;
  SubstituteArg local_248;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  ulong local_158;
  DebugStringOptions *local_150;
  SubstituteArg local_148;
  string local_118;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  SourceLocationCommentPrinter comment_printer;
  
  if (*(char *)(*(long *)(this + 0x20) + 0x4b) == '\0') {
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
    comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
         (pointer)&comment_printer.source_loc_.leading_comments.field_2;
    comment_printer.source_loc_.leading_comments._M_string_length = 0;
    comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
    comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
         (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
    comment_printer.source_loc_.trailing_comments._M_string_length = 0;
    comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    comment_printer.options_.include_comments = debug_string_options->include_comments;
    comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
    comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
    comment_printer.prefix_._M_dataplus._M_p = (pointer)&comment_printer.prefix_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&comment_printer.prefix_,prefix._M_dataplus._M_p,
               prefix._M_dataplus._M_p +
               CONCAT44(prefix._M_string_length._4_4_,(_Rb_tree_color)prefix._M_string_length));
    local_150 = debug_string_options;
    if (debug_string_options->include_comments == true) {
      comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
    }
    else {
      comment_printer.have_source_loc_ = false;
    }
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
    if (include_opening_clause) {
      groups._M_t._M_impl._0_8_ = prefix._M_dataplus._M_p;
      groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)prefix._M_string_length;
      local_308.text_ = (char *)**(undefined8 **)(this + 8);
      local_308.size_ = *(int *)(*(undefined8 **)(this + 8) + 1);
      local_2d8.text_ = (char *)0x0;
      local_2d8.size_ = -1;
      local_188.text_ = (char *)0x0;
      local_188.size_ = -1;
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_1e8.text_ = (char *)0x0;
      local_1e8.size_ = -1;
      local_218.text_ = (char *)0x0;
      local_218.size_ = -1;
      local_248.text_ = (char *)0x0;
      local_248.size_ = -1;
      local_278.text_ = (char *)0x0;
      local_278.size_ = -1;
      local_2a8.text_ = (char *)0x0;
      local_2a8.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0message $1",(SubstituteArg *)&groups,&local_308,&local_2d8,&local_188,
                 &local_148,&local_1e8,&local_218,&local_248,&local_278,&local_2a8);
    }
    std::__cxx11::string::append((char *)contents);
    iVar9 = depth + 1;
    anon_unknown_1::FormatLineOptions
              (iVar9,*(Message **)(this + 0x20),*(DescriptorPool **)(*(long *)(this + 0x10) + 0x10),
               contents);
    p_Var1 = &groups._M_t._M_impl.super__Rb_tree_header;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_158 = (ulong)(uint)depth;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (0 < *(int *)(this + 4)) {
      lVar8 = 0;
      lVar10 = 0;
      do {
        lVar11 = *(long *)(this + 0x28);
        poVar3 = *(once_flag **)(lVar11 + 0x18 + lVar8);
        if (poVar3 != (once_flag *)0x0) {
          local_2d8.text_ = (char *)(lVar8 + lVar11);
          local_308.text_ = (char *)FieldDescriptor::TypeOnceInit;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (poVar3,(_func_void_FieldDescriptor_ptr **)&local_308,
                     (FieldDescriptor **)&local_2d8);
        }
        if (*(char *)(lVar11 + 2 + lVar8) == '\n') {
          local_308.text_ =
               (char *)FieldDescriptor::message_type
                                 ((FieldDescriptor *)(*(long *)(this + 0x28) + lVar8));
          std::
          _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
          ::_M_insert_unique<google::protobuf::Descriptor_const*>
                    ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                      *)&groups,(Descriptor **)&local_308);
        }
        lVar10 = lVar10 + 1;
        lVar8 = lVar8 + 0x48;
      } while (lVar10 < *(int *)(this + 4));
    }
    debug_string_options_00 = local_150;
    if (0 < *(int *)(this + 0x7c)) {
      lVar8 = 0;
      lVar10 = 0;
      do {
        lVar11 = *(long *)(this + 0x50);
        poVar3 = *(once_flag **)(lVar11 + 0x18 + lVar8);
        if (poVar3 != (once_flag *)0x0) {
          local_2d8.text_ = (char *)(lVar8 + lVar11);
          local_308.text_ = (char *)FieldDescriptor::TypeOnceInit;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (poVar3,(_func_void_FieldDescriptor_ptr **)&local_308,
                     (FieldDescriptor **)&local_2d8);
        }
        debug_string_options_00 = local_150;
        if (*(char *)(lVar11 + 2 + lVar8) == '\n') {
          local_308.text_ =
               (char *)FieldDescriptor::message_type
                                 ((FieldDescriptor *)(*(long *)(this + 0x50) + lVar8));
          std::
          _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
          ::_M_insert_unique<google::protobuf::Descriptor_const*>
                    ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                      *)&groups,(Descriptor **)&local_308);
        }
        lVar10 = lVar10 + 1;
        lVar8 = lVar8 + 0x48;
      } while (lVar10 < *(int *)(this + 0x7c));
    }
    if (0 < *(int *)(this + 0x70)) {
      lVar8 = 0;
      do {
        this_01 = (Descriptor *)(lVar8 * 0x88 + *(long *)(this + 0x38));
        p_Var5 = &p_Var1->_M_header;
        for (p_Var4 = groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
            p_Var4 = (&p_Var4->_M_left)[*(Descriptor **)(p_Var4 + 1) < this_01]) {
          if (*(Descriptor **)(p_Var4 + 1) >= this_01) {
            p_Var5 = p_Var4;
          }
        }
        p_Var7 = p_Var1;
        if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
           (p_Var7 = (_Rb_tree_header *)p_Var5,
           this_01 < (Descriptor *)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
          p_Var7 = p_Var1;
        }
        if (p_Var7 == p_Var1) {
          DebugString(this_01,iVar9,contents,debug_string_options_00,true);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < *(int *)(this + 0x70));
    }
    if (0 < *(int *)(this + 0x74)) {
      lVar8 = 0;
      lVar10 = 0;
      do {
        EnumDescriptor::DebugString
                  ((EnumDescriptor *)(*(long *)(this + 0x40) + lVar8),iVar9,contents,
                   debug_string_options_00);
        lVar10 = lVar10 + 1;
        lVar8 = lVar8 + 0x48;
      } while (lVar10 < *(int *)(this + 0x74));
    }
    if (0 < *(int *)(this + 4)) {
      lVar10 = 0;
      lVar8 = 0;
      do {
        lVar11 = *(long *)(this + 0x28);
        bVar2 = *(byte *)(lVar11 + 1 + lVar10);
        this_00 = *(OneofDescriptor **)(lVar11 + 0x28 + lVar10);
        if ((this_00 == (OneofDescriptor *)0x0 || (bVar2 & 0x10) == 0) ||
           ((*(int *)(this_00 + 4) == 1 &&
            (((*(byte *)(*(long *)(this_00 + 0x20) + 1) & 2) != 0 ||
             (this_00 == (OneofDescriptor *)0x0)))))) {
          FieldDescriptor::DebugString
                    ((FieldDescriptor *)(lVar11 + lVar10),iVar9,contents,debug_string_options_00);
        }
        else {
          if ((bVar2 & 0x10) == 0) {
            this_00 = (OneofDescriptor *)0x0;
          }
          if ((FieldDescriptor *)(lVar11 + lVar10) == *(FieldDescriptor **)(this_00 + 0x20)) {
            OneofDescriptor::DebugString(this_00,iVar9,contents,debug_string_options_00);
          }
        }
        lVar8 = lVar8 + 1;
        lVar10 = lVar10 + 0x48;
      } while (lVar8 < *(int *)(this + 4));
    }
    if (0 < *(int *)(this + 0x78)) {
      lVar8 = 0;
      lVar10 = 0;
      do {
        local_308.text_ = prefix._M_dataplus._M_p;
        local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
        local_2d8.text_ =
             FastInt32ToBuffer(*(int32 *)(*(long *)(this + 0x48) + lVar8),local_2d8.scratch_);
        sVar6 = strlen(local_2d8.text_);
        local_2d8.size_ = (int)sVar6;
        local_188.text_ =
             FastInt32ToBuffer(*(int *)(*(long *)(this + 0x48) + 4 + lVar8) + -1,local_188.scratch_)
        ;
        sVar6 = strlen(local_188.text_);
        local_188.size_ = (int)sVar6;
        local_148.text_ = (char *)0x0;
        local_148.size_ = -1;
        local_1e8.text_ = (char *)0x0;
        local_1e8.size_ = -1;
        local_218.text_ = (char *)0x0;
        local_218.size_ = -1;
        local_248.text_ = (char *)0x0;
        local_248.size_ = -1;
        local_278.text_ = (char *)0x0;
        local_278.size_ = -1;
        local_2a8.text_ = (char *)0x0;
        local_2a8.size_ = -1;
        local_1b8.text_ = (char *)0x0;
        local_1b8.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0  extensions $1 to $2;\n",&local_308,&local_2d8,&local_188,&local_148
                   ,&local_1e8,&local_218,&local_248,&local_278,&local_2a8,&local_1b8);
        lVar10 = lVar10 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar10 < *(int *)(this + 0x78));
    }
    if (0 < *(int *)(this + 0x7c)) {
      local_158 = (ulong)((int)local_158 + 2);
      lVar10 = 0;
      lVar11 = 0;
      lVar8 = 0;
      do {
        if (*(long *)(*(long *)(this + 0x50) + 0x20 + lVar10) != lVar8) {
          if (lVar10 != 0) {
            local_308.text_ = prefix._M_dataplus._M_p;
            local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
            local_2d8.text_ = (char *)0x0;
            local_2d8.size_ = -1;
            local_188.text_ = (char *)0x0;
            local_188.size_ = -1;
            local_148.text_ = (char *)0x0;
            local_148.size_ = -1;
            local_1e8.text_ = (char *)0x0;
            local_1e8.size_ = -1;
            local_218.text_ = (char *)0x0;
            local_218.size_ = -1;
            local_248.text_ = (char *)0x0;
            local_248.size_ = -1;
            local_278.text_ = (char *)0x0;
            local_278.size_ = -1;
            local_2a8.text_ = (char *)0x0;
            local_2a8.size_ = -1;
            local_1b8.text_ = (char *)0x0;
            local_1b8.size_ = -1;
            strings::SubstituteAndAppend
                      (contents,"$0  }\n",&local_308,&local_2d8,&local_188,&local_148,&local_1e8,
                       &local_218,&local_248,&local_278,&local_2a8,&local_1b8);
          }
          lVar8 = *(long *)(*(long *)(this + 0x50) + 0x20 + lVar10);
          local_308.text_ = prefix._M_dataplus._M_p;
          local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
          local_2d8.text_ = *(char **)(*(long *)(lVar8 + 8) + 0x20);
          local_2d8.size_ = *(int *)(*(long *)(lVar8 + 8) + 0x28);
          local_188.text_ = (char *)0x0;
          local_188.size_ = -1;
          local_148.text_ = (char *)0x0;
          local_148.size_ = -1;
          local_1e8.text_ = (char *)0x0;
          local_1e8.size_ = -1;
          local_218.text_ = (char *)0x0;
          local_218.size_ = -1;
          local_248.text_ = (char *)0x0;
          local_248.size_ = -1;
          local_278.text_ = (char *)0x0;
          local_278.size_ = -1;
          local_2a8.text_ = (char *)0x0;
          local_2a8.size_ = -1;
          local_1b8.text_ = (char *)0x0;
          local_1b8.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0  extend .$1 {\n",&local_308,&local_2d8,&local_188,&local_148,
                     &local_1e8,&local_218,&local_248,&local_278,&local_2a8,&local_1b8);
        }
        FieldDescriptor::DebugString
                  ((FieldDescriptor *)(*(long *)(this + 0x50) + lVar10),(int)local_158,contents,
                   local_150);
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 0x48;
      } while (lVar11 < *(int *)(this + 0x7c));
      if (0 < *(int *)(this + 0x7c)) {
        local_308.text_ = prefix._M_dataplus._M_p;
        local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
        local_2d8.text_ = (char *)0x0;
        local_2d8.size_ = -1;
        local_188.text_ = (char *)0x0;
        local_188.size_ = -1;
        local_148.text_ = (char *)0x0;
        local_148.size_ = -1;
        local_1e8.text_ = (char *)0x0;
        local_1e8.size_ = -1;
        local_218.text_ = (char *)0x0;
        local_218.size_ = -1;
        local_248.text_ = (char *)0x0;
        local_248.size_ = -1;
        local_278.text_ = (char *)0x0;
        local_278.size_ = -1;
        local_2a8.text_ = (char *)0x0;
        local_2a8.size_ = -1;
        local_1b8.text_ = (char *)0x0;
        local_1b8.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0  }\n",&local_308,&local_2d8,&local_188,&local_148,&local_1e8,
                   &local_218,&local_248,&local_278,&local_2a8,&local_1b8);
      }
    }
    if (0 < *(int *)(this + 0x80)) {
      local_308.text_ = prefix._M_dataplus._M_p;
      local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
      local_2d8.text_ = (char *)0x0;
      local_2d8.size_ = -1;
      local_188.text_ = (char *)0x0;
      local_188.size_ = -1;
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_1e8.text_ = (char *)0x0;
      local_1e8.size_ = -1;
      local_218.text_ = (char *)0x0;
      local_218.size_ = -1;
      local_248.text_ = (char *)0x0;
      local_248.size_ = -1;
      local_278.text_ = (char *)0x0;
      local_278.size_ = -1;
      local_2a8.text_ = (char *)0x0;
      local_2a8.size_ = -1;
      local_1b8.text_ = (char *)0x0;
      local_1b8.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  reserved ",&local_308,&local_2d8,&local_188,&local_148,&local_1e8,
                 &local_218,&local_248,&local_278,&local_2a8,&local_1b8);
      if (0 < *(int *)(this + 0x80)) {
        lVar8 = 0;
        do {
          lVar10 = *(long *)(this + 0x58);
          iVar9 = *(int *)(lVar10 + 4 + lVar8 * 8);
          if (iVar9 == *(int *)(lVar10 + lVar8 * 8) + 1) {
            local_308.text_ = FastInt32ToBuffer(*(int32 *)(lVar10 + lVar8 * 8),local_308.scratch_);
            sVar6 = strlen(local_308.text_);
            local_308.size_ = (int)sVar6;
            local_2d8.text_ = (char *)0x0;
            local_2d8.size_ = -1;
            local_188.text_ = (char *)0x0;
            local_188.size_ = -1;
            local_148.text_ = (char *)0x0;
            local_148.size_ = -1;
            local_1e8.text_ = (char *)0x0;
            local_1e8.size_ = -1;
            local_218.text_ = (char *)0x0;
            local_218.size_ = -1;
            local_248.text_ = (char *)0x0;
            local_248.size_ = -1;
            local_278.text_ = (char *)0x0;
            local_278.size_ = -1;
            local_2a8.text_ = (char *)0x0;
            local_2a8.size_ = -1;
            local_1b8.text_ = (char *)0x0;
            local_1b8.size_ = -1;
            strings::SubstituteAndAppend
                      (contents,"$0, ",&local_308,&local_2d8,&local_188,&local_148,&local_1e8,
                       &local_218,&local_248,&local_278,&local_2a8,&local_1b8);
          }
          else if (iVar9 < 0x20000000) {
            local_308.text_ = FastInt32ToBuffer(*(int32 *)(lVar10 + lVar8 * 8),local_308.scratch_);
            sVar6 = strlen(local_308.text_);
            local_308.size_ = (int)sVar6;
            local_2d8.text_ =
                 FastInt32ToBuffer(*(int *)(lVar10 + 4 + lVar8 * 8) + -1,local_2d8.scratch_);
            sVar6 = strlen(local_2d8.text_);
            local_2d8.size_ = (int)sVar6;
            local_188.text_ = (char *)0x0;
            local_188.size_ = -1;
            local_148.text_ = (char *)0x0;
            local_148.size_ = -1;
            local_1e8.text_ = (char *)0x0;
            local_1e8.size_ = -1;
            local_218.text_ = (char *)0x0;
            local_218.size_ = -1;
            local_248.text_ = (char *)0x0;
            local_248.size_ = -1;
            local_278.text_ = (char *)0x0;
            local_278.size_ = -1;
            local_2a8.text_ = (char *)0x0;
            local_2a8.size_ = -1;
            local_1b8.text_ = (char *)0x0;
            local_1b8.size_ = -1;
            strings::SubstituteAndAppend
                      (contents,"$0 to $1, ",&local_308,&local_2d8,&local_188,&local_148,&local_1e8,
                       &local_218,&local_248,&local_278,&local_2a8,&local_1b8);
          }
          else {
            local_308.text_ = FastInt32ToBuffer(*(int32 *)(lVar10 + lVar8 * 8),local_308.scratch_);
            sVar6 = strlen(local_308.text_);
            local_308.size_ = (int)sVar6;
            local_2d8.text_ = (char *)0x0;
            local_2d8.size_ = -1;
            local_188.text_ = (char *)0x0;
            local_188.size_ = -1;
            local_148.text_ = (char *)0x0;
            local_148.size_ = -1;
            local_1e8.text_ = (char *)0x0;
            local_1e8.size_ = -1;
            local_218.text_ = (char *)0x0;
            local_218.size_ = -1;
            local_248.text_ = (char *)0x0;
            local_248.size_ = -1;
            local_278.text_ = (char *)0x0;
            local_278.size_ = -1;
            local_2a8.text_ = (char *)0x0;
            local_2a8.size_ = -1;
            local_1b8.text_ = (char *)0x0;
            local_1b8.size_ = -1;
            strings::SubstituteAndAppend
                      (contents,"$0 to max, ",&local_308,&local_2d8,&local_188,&local_148,&local_1e8
                       ,&local_218,&local_248,&local_278,&local_2a8,&local_1b8);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < *(int *)(this + 0x80));
      }
      std::__cxx11::string::replace
                ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x410f56);
    }
    if (0 < *(int *)(this + 0x84)) {
      local_308.text_ = prefix._M_dataplus._M_p;
      local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
      local_2d8.text_ = (char *)0x0;
      local_2d8.size_ = -1;
      local_188.text_ = (char *)0x0;
      local_188.size_ = -1;
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_1e8.text_ = (char *)0x0;
      local_1e8.size_ = -1;
      local_218.text_ = (char *)0x0;
      local_218.size_ = -1;
      local_248.text_ = (char *)0x0;
      local_248.size_ = -1;
      local_278.text_ = (char *)0x0;
      local_278.size_ = -1;
      local_2a8.text_ = (char *)0x0;
      local_2a8.size_ = -1;
      local_1b8.text_ = (char *)0x0;
      local_1b8.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  reserved ",&local_308,&local_2d8,&local_188,&local_148,&local_1e8,
                 &local_218,&local_248,&local_278,&local_2a8,&local_1b8);
      if (0 < *(int *)(this + 0x84)) {
        lVar8 = 0;
        do {
          CEscape(&local_118,*(string **)(*(long *)(this + 0x60) + lVar8 * 8));
          local_308.text_ = local_118._M_dataplus._M_p;
          local_308.size_ = (_Rb_tree_color)local_118._M_string_length;
          local_2d8.text_ = (char *)0x0;
          local_2d8.size_ = -1;
          local_188.text_ = (char *)0x0;
          local_188.size_ = -1;
          local_148.text_ = (char *)0x0;
          local_148.size_ = -1;
          local_1e8.text_ = (char *)0x0;
          local_1e8.size_ = -1;
          local_218.text_ = (char *)0x0;
          local_218.size_ = -1;
          local_248.text_ = (char *)0x0;
          local_248.size_ = -1;
          local_278.text_ = (char *)0x0;
          local_278.size_ = -1;
          local_2a8.text_ = (char *)0x0;
          local_2a8.size_ = -1;
          local_1b8.text_ = (char *)0x0;
          local_1b8.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"\"$0\", ",&local_308,&local_2d8,&local_188,&local_148,&local_1e8,
                     &local_218,&local_248,&local_278,&local_2a8,&local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < *(int *)(this + 0x84));
      }
      std::__cxx11::string::replace
                ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x410f56);
    }
    local_308.text_ = prefix._M_dataplus._M_p;
    local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
    local_2d8.text_ = (char *)0x0;
    local_2d8.size_ = -1;
    local_188.text_ = (char *)0x0;
    local_188.size_ = -1;
    local_148.text_ = (char *)0x0;
    local_148.size_ = -1;
    local_1e8.text_ = (char *)0x0;
    local_1e8.size_ = -1;
    local_218.text_ = (char *)0x0;
    local_218.size_ = -1;
    local_248.text_ = (char *)0x0;
    local_248.size_ = -1;
    local_278.text_ = (char *)0x0;
    local_278.size_ = -1;
    local_2a8.text_ = (char *)0x0;
    local_2a8.size_ = -1;
    local_1b8.text_ = (char *)0x0;
    local_1b8.size_ = -1;
    strings::SubstituteAndAppend
              (contents,"$0}\n",&local_308,&local_2d8,&local_188,&local_148,&local_1e8,&local_218,
               &local_248,&local_278,&local_2a8,&local_1b8);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
    std::
    _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::~_Rb_tree(&groups._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment_printer.prefix_._M_dataplus._M_p != &comment_printer.prefix_.field_2) {
      operator_delete(comment_printer.prefix_._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&comment_printer.source_loc_.leading_detached_comments);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment_printer.source_loc_.trailing_comments._M_dataplus._M_p !=
        &comment_printer.source_loc_.trailing_comments.field_2) {
      operator_delete(comment_printer.source_loc_.trailing_comments._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment_printer.source_loc_.leading_comments._M_dataplus._M_p !=
        &comment_printer.source_loc_.leading_comments.field_2) {
      operator_delete(comment_printer.source_loc_.leading_comments._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prefix._M_dataplus._M_p != &prefix.field_2) {
      operator_delete(prefix._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

const EnumDescriptor* DescriptorPool::FindEnumTypeByName(
    ConstStringParam name) const {
  return tables_->FindByNameHelper(this, name).enum_descriptor();
}